

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O0

int __thiscall
OpenMD::FluctuatingChargeConstraints::getNumberOfFlucQAtoms(FluctuatingChargeConstraints *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long in_RDI;
  int region;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  int nFlucq;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Atom *local_38;
  Molecule *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffd8;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> in_stack_ffffffffffffffe0;
  int local_14;
  int local_4;
  
  local_14 = 0;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize((FluctuatingChargeConstraints *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    local_4 = 0;
  }
  else {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
               &stack0xffffffffffffffe0);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                         *)&stack0xffffffffffffffd8);
    local_30 = SimInfo::beginMolecule
                         ((SimInfo *)in_stack_ffffffffffffffe0._M_node,
                          (MoleculeIterator *)in_stack_ffffffffffffffd8._M_current);
    while (local_30 != (Molecule *)0x0) {
      bVar1 = Molecule::constrainTotalCharge(local_30);
      if (bVar1) {
        sVar3 = Molecule::getNFluctuatingCharges((Molecule *)0x3c7240);
        local_14 = local_14 + (int)sVar3;
      }
      else {
        iVar2 = Molecule::getRegion((Molecule *)0x3c725e);
        if (((*(byte *)(in_RDI + 10) & 1) == 0) || (iVar2 < 0)) {
          local_38 = Molecule::beginFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffffe0._M_node,
                                (iterator *)in_stack_ffffffffffffffd8._M_current);
          while (local_38 != (Atom *)0x0) {
            local_14 = local_14 + 1;
            local_38 = Molecule::nextFluctuatingCharge
                                 ((Molecule *)in_stack_ffffffffffffffe0._M_node,
                                  (iterator *)in_stack_ffffffffffffffd8._M_current);
          }
        }
        else {
          local_38 = Molecule::beginFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffffe0._M_node,
                                (iterator *)in_stack_ffffffffffffffd8._M_current);
          while (local_38 != (Atom *)0x0) {
            local_14 = local_14 + 1;
            local_38 = Molecule::nextFluctuatingCharge
                                 ((Molecule *)in_stack_ffffffffffffffe0._M_node,
                                  (iterator *)in_stack_ffffffffffffffd8._M_current);
          }
        }
      }
      local_30 = SimInfo::nextMolecule
                           ((SimInfo *)in_stack_ffffffffffffffe0._M_node,
                            (MoleculeIterator *)in_stack_ffffffffffffffd8._M_current);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int FluctuatingChargeConstraints::getNumberOfFlucQAtoms() {
    int nFlucq = 0;
    if (!initialized_) initialize();
    if (!hasFlucQ_) return 0;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (mol->constrainTotalCharge()) {
        nFlucq += mol->getNFluctuatingCharges();
      } else {
        int region = mol->getRegion();
        if (constrainRegions_ && region >= 0) {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            nFlucq++;
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            nFlucq++;
          }
        }
      }
    }
    return nFlucq;
  }